

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::SkipWS(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,bool skip_cr)

{
  bool bVar1;
  byte *pbVar2;
  eval_error *this_00;
  element_type *t_fname;
  char *pcVar3;
  bool local_9b;
  bool local_9a;
  bool local_99;
  Position local_78;
  bool local_56;
  undefined1 local_55;
  bool end_line;
  allocator<char> local_39;
  string local_38;
  byte local_12;
  byte local_11;
  bool retval;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *pCStack_10;
  bool skip_cr_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  local_12 = 0;
  local_11 = skip_cr;
  pCStack_10 = this;
  while (bVar1 = Position::has_more(&this->m_position), bVar1) {
    pbVar2 = (byte *)Position::operator*(&this->m_position);
    if (0x7e < *pbVar2) {
      local_55 = 1;
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Illegal character",&local_39);
      File_Position::File_Position
                ((File_Position *)&stack0xffffffffffffffac,(this->m_position).line,
                 (this->m_position).col);
      t_fname = std::
                __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_filename);
      exception::eval_error::eval_error
                (this_00,&local_38,(File_Position *)&stack0xffffffffffffffac,t_fname);
      local_55 = 0;
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    pcVar3 = Position::operator*(&this->m_position);
    local_99 = false;
    if (*pcVar3 != '\0') {
      pcVar3 = Position::operator*(&this->m_position);
      local_9a = true;
      if (*pcVar3 != '\n') {
        pcVar3 = Position::operator*(&this->m_position);
        local_9b = false;
        if (*pcVar3 == '\r') {
          Position::operator+(&local_78,&this->m_position,1);
          pcVar3 = Position::operator*(&local_78);
          local_9b = *pcVar3 == '\n';
        }
        local_9a = local_9b;
      }
      local_99 = local_9a;
    }
    local_56 = local_99;
    pcVar3 = Position::operator*(&this->m_position);
    bVar1 = char_in_alphabet(this,*pcVar3,white_alphabet);
    if ((bVar1) || (((local_11 & 1) != 0 && ((local_56 & 1U) != 0)))) {
      if (((local_56 & 1U) != 0) &&
         (pcVar3 = Position::operator*(&this->m_position), *pcVar3 == '\r')) {
        Position::operator++(&this->m_position);
      }
      Position::operator++(&this->m_position);
    }
    else {
      bVar1 = SkipComment(this);
      if (!bVar1) break;
    }
    local_12 = 1;
  }
  return (bool)(local_12 & 1);
}

Assistant:

bool SkipWS(bool skip_cr = false) {
        bool retval = false;

        while (m_position.has_more()) {
          if (static_cast<unsigned char>(*m_position) > 0x7e) {
            throw exception::eval_error("Illegal character", File_Position(m_position.line, m_position.col), *m_filename);
          }
          auto end_line = (*m_position != 0) && ((*m_position == '\n') || (*m_position == '\r' && *(m_position + 1) == '\n'));

          if (char_in_alphabet(*m_position, detail::white_alphabet) || (skip_cr && end_line)) {
            if (end_line) {
              if (*m_position == '\r') {
                // discards lf
                ++m_position;
              }
            }

            ++m_position;

            retval = true;
          } else if (SkipComment()) {
            retval = true;
          } else {
            break;
          }
        }
        return retval;
      }